

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nagel.c
# Opt level: O2

void horn_relax(qnode_ptr_t p,float alpha,int n,char *fn,int prod_err)

{
  disp_vect_t *pdVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  int iVar5;
  param512_t *papVar6;
  disp_vect_t dVar7;
  int iVar8;
  qnode_ptr_t ptVar9;
  disp_field512_t *__ptr;
  qnode_ptr_t q;
  disp_field512_t *padVar10;
  int iVar11;
  long lVar12;
  int y;
  long lVar13;
  long lVar14;
  float fVar15;
  undefined4 in_XMM0_Db;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  float fVar18;
  double dVar19;
  int local_a4;
  float std;
  float avg;
  qnode_ptr_t local_80;
  qnode_ptr_t local_78;
  disp_field512_t *local_70;
  long local_68;
  qnode_ptr_t local_60;
  double local_58;
  long local_50;
  float local_48;
  
  ptVar9 = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst);
  __ptr = (disp_field512_t *)malloc(0xc3080);
  ptVar9->flow_ptr = __ptr;
  if (prod_err != 0) {
    q = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst);
    padVar10 = (disp_field512_t *)malloc(0xc3080);
    q->flow_ptr = padVar10;
    local_80 = q;
    load_velocity(q,fn);
  }
  iVar4 = p->sizy;
  iVar11 = p->ofst;
  lVar12 = (long)iVar11;
  for (; iVar11 < iVar4; iVar11 = iVar11 + 1) {
    iVar8 = p->sizx;
    for (lVar13 = lVar12; (int)lVar13 < iVar8; lVar13 = lVar13 + 1) {
      pdVar1 = *p->flow_ptr + (long)p->res * (long)iVar11 + lVar13;
      pdVar1->x = 0.0;
      pdVar1->y = 0.0;
    }
  }
  local_58 = (double)(float)(double)CONCAT44(in_XMM0_Db,alpha) *
             (double)(float)(double)CONCAT44(in_XMM0_Db,alpha);
  local_a4 = 0;
  local_78 = ptVar9;
  local_70 = __ptr;
  local_60 = p;
  if (n < 1) {
    n = 0;
  }
  while (local_a4 != n) {
    iVar4 = p->sizy;
    iVar11 = p->ofst;
    local_68 = (long)iVar11;
    for (iVar8 = iVar11; iVar8 < iVar4; iVar8 = iVar8 + 1) {
      iVar5 = p->sizx;
      for (lVar12 = local_68; (int)lVar12 < iVar5; lVar12 = lVar12 + 1) {
        (*__ptr)[(long)ptVar9->res * (long)iVar8 + lVar12] =
             (*p->flow_ptr)[(long)p->res * (long)iVar8 + lVar12];
      }
    }
    for (iVar8 = iVar11; iVar8 < iVar4 - iVar11; iVar8 = iVar8 + 1) {
      iVar5 = p->sizx;
      lVar13 = (long)iVar8;
      local_50 = lVar13;
      for (lVar12 = local_68; ptVar9 = local_78, y = (int)lVar12, y < iVar5 - iVar11;
          lVar12 = lVar12 + 1) {
        papVar6 = p->param_ptr[p->sizz / 2];
        lVar14 = p->res * lVar13 + lVar12;
        if ((*papVar6)[lVar14].err == 0) {
          fVar18 = (*papVar6)[lVar14].ft;
          local_48 = lapu(local_78,iVar8,y);
          fVar15 = lapv(ptVar9,iVar8,y);
          uVar2 = (*papVar6)[lVar14].fx;
          uVar3 = (*papVar6)[lVar14].fy;
          fVar18 = (float)uVar2 * local_48 + (float)uVar3 * fVar15 + fVar18;
          dVar19 = (double)(float)uVar3 * (double)(float)uVar3 +
                   (double)(float)uVar2 * (double)(float)uVar2 + local_58;
          auVar16._0_8_ = (double)(fVar18 * (float)uVar2);
          auVar16._8_8_ = (double)(fVar18 * (float)uVar3);
          auVar17._8_8_ = dVar19;
          auVar17._0_8_ = dVar19;
          auVar17 = divpd(auVar16,auVar17);
          dVar7.y = (float)((double)fVar15 - auVar17._8_8_);
          dVar7.x = (float)((double)local_48 - auVar17._0_8_);
          (*local_60->flow_ptr)[lVar14] = dVar7;
          lVar13 = local_50;
          p = local_60;
        }
      }
      __ptr = local_70;
    }
    local_a4 = local_a4 + 1;
    printf(" Iteration %3d :\n");
    if (prod_err != 0) {
      flow_error(p,local_80,&avg,&std);
      printf("    Average Angular Error : %10.5f\n",SUB84((double)avg,0));
      printf("       Standard Deviation : %10.5f\n",SUB84((double)std,0));
    }
    fVar18 = flow_l2_norm(ptVar9,p);
    printf("       L2 Norm Difference : %10.5f\n",SUB84((double)fVar18,0));
    fflush(_stdout);
  }
  free(__ptr);
  free(ptVar9);
  ptVar9 = local_80;
  if (prod_err == 0) {
    return;
  }
  free(local_80->flow_ptr);
  free(ptVar9);
  return;
}

Assistant:

void horn_relax(p,alpha,n,fn,prod_err)
qnode_ptr_t p ;
float alpha ;
int n, prod_err ;
string fn ;

{ qnode_ptr_t create_node(), q, r ;
  param_t f ;
  float lapu(), lapv(), flow_l2_norm(), u_bar, v_bar, avg, std ;
  int i, j, k ;

  q = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst) ;
  q->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;

  if (prod_err) {
    r = create_node(0,p->res,p->sizx,p->sizy,p->sizz,p->ofst) ;
    r->flow_ptr = (disp_field512_t *)malloc(sizeof(disp_field512_t)) ;
    load_velocity(r,fn) ;
  }

  for (i = p->ofst ; i < p->sizy ; i++) {
    for (j = p->ofst ; j < p->sizx ; j++) {
      (*p->flow_ptr)[p->res*i + j].x = 0.0 ;
      (*p->flow_ptr)[p->res*i + j].y = 0.0 ;
    }
  }
  for (k = 0 ; k < n ; k++) {
    for (i = p->ofst ; i < p->sizy ; i++) {
      for (j = p->ofst ; j < p->sizx ; j++) {
        (*q->flow_ptr)[q->res*i + j] = (*p->flow_ptr)[p->res*i + j] ;
      }
    }
    for (i = p->ofst ; i < p->sizy - p->ofst ; i++) {
      for (j = p->ofst ; j < p->sizx - p->ofst ; j++) {
        if ((*p->param_ptr[p->sizz/2])[p->res*i + j].err == NO_ERROR) {
          f = (*p->param_ptr[p->sizz/2])[p->res*i + j] ;

          u_bar = lapu(q,i,j) ;
          v_bar = lapv(q,i,j) ;

          (*p->flow_ptr)[p->res*i + j].x =
          u_bar - f.fx*(f.fx*u_bar + f.fy*v_bar + f.ft)
          /(pow(f.fx,2.0) + pow(f.fy,2.0) + pow(alpha,2.0)) ;

          (*p->flow_ptr)[p->res*i + j].y =
          v_bar - f.fy*(f.fx*u_bar + f.fy*v_bar + f.ft)
          /(pow(f.fx,2.0) + pow(f.fy,2.0) + pow(alpha,2.0)) ;
        }
      }
    }
    printf(" Iteration %3d :\n",k+1) ;
    if (prod_err) {
      flow_error(p,r,&avg,&std) ;
      printf("    Average Angular Error : %10.5f\n",avg) ;
      printf("       Standard Deviation : %10.5f\n",std) ;
    }
    printf("       L2 Norm Difference : %10.5f\n",flow_l2_norm(q,p)) ;
    fflush(stdout) ;
  }
  free((disp_field512_t *)q->flow_ptr) ;
  free(q) ;
  if (prod_err) {
    free((disp_field512_t *)r->flow_ptr) ;
    free(r) ;
  }
}